

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 matchOther)

{
  u8 uVar1;
  bool bVar2;
  u32 uVar3;
  uint uVar4;
  u32 uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  u8 *puVar12;
  u32 uVar13;
  ulong uVar14;
  byte *pbVar15;
  bool bVar16;
  u8 *local_60;
  byte *local_58;
  uint local_4c;
  compareInfo *local_48;
  char local_3f;
  uchar local_3e;
  undefined1 local_3d;
  uint local_3c;
  u8 *local_38;
  
  uVar11 = (uint)pInfo->matchOne;
  uVar1 = pInfo->noCase;
  local_38 = (u8 *)0x0;
  local_3c = (uint)pInfo->matchAll;
  uVar7 = (uint)pInfo->matchAll;
  local_60 = zPattern;
  local_58 = zString;
  local_4c = matchOther;
  local_48 = pInfo;
LAB_001359d5:
  do {
    uVar13 = (u32)(char)*local_60;
    if ((char)*local_60 < '\0') {
      uVar13 = sqlite3Utf8Read(&local_60);
    }
    else {
      local_60 = local_60 + 1;
    }
    if (uVar13 == 0) {
      return (uint)(*local_58 != 0);
    }
    if (uVar13 == uVar7) {
      goto LAB_00135bc2;
    }
    if (uVar13 == local_4c) {
      if (local_48->matchSet != '\0') {
        uVar13 = sqlite3Utf8Read(&local_58);
        if (uVar13 == 0) {
          return 1;
        }
        uVar3 = sqlite3Utf8Read(&local_60);
        uVar5 = 0;
        bVar16 = uVar3 == 0x5e;
        if (bVar16) {
          uVar3 = sqlite3Utf8Read(&local_60);
        }
        bVar9 = false;
        if (uVar3 != 0x5d) goto LAB_00135b37;
        bVar9 = uVar13 == 0x5d;
LAB_00135b28:
        uVar5 = 0;
LAB_00135b2a:
        uVar3 = sqlite3Utf8Read(&local_60);
LAB_00135b37:
        if (uVar3 == 0x2d) {
          if ((*local_60 != ']') && (uVar5 != 0 && *local_60 != '\0')) break;
        }
        else {
          if (uVar3 == 0x5d) {
            uVar7 = local_3c;
            if (bVar9 == bVar16) {
              return 1;
            }
            goto LAB_001359d5;
          }
          if (uVar3 == 0) {
            return 1;
          }
        }
        uVar5 = uVar3;
        if (uVar13 == uVar3) {
          bVar9 = true;
        }
        goto LAB_00135b2a;
      }
      uVar13 = sqlite3Utf8Read(&local_60);
      if (uVar13 == 0) {
        return 1;
      }
      local_38 = local_60;
    }
    uVar4 = (uint)(char)*local_58;
    if ((char)*local_58 < '\0') {
      uVar4 = sqlite3Utf8Read(&local_58);
    }
    else {
      local_58 = local_58 + 1;
    }
    if ((uVar13 != uVar4) &&
       (((uVar1 == '\0' || (0x7f < (uVar4 | uVar13))) || (""[uVar13 & 0xff] != ""[uVar4 & 0xff]))))
    {
      if (uVar13 != uVar11) {
        return 1;
      }
      if (uVar4 == 0) {
        return 1;
      }
      if (local_60 == local_38) {
        return 1;
      }
    }
  } while( true );
  uVar3 = sqlite3Utf8Read(&local_60);
  bVar2 = true;
  if (uVar3 < uVar13) {
    bVar2 = bVar9;
  }
  if (uVar5 <= uVar13) {
    bVar9 = bVar2;
  }
  goto LAB_00135b28;
LAB_00135bc2:
  uVar4 = (uint)(char)*local_60;
  if ((int)uVar4 < 0) {
    uVar4 = sqlite3Utf8Read(&local_60);
  }
  else {
    local_60 = local_60 + 1;
  }
  if (uVar4 == uVar11 || uVar4 == uVar7) {
    if ((uVar4 != uVar11) || (uVar13 = sqlite3Utf8Read(&local_58), uVar13 != 0)) goto LAB_00135bc2;
  }
  else {
    if (uVar4 == 0) {
      return 0;
    }
    if (uVar4 == local_4c) {
      if (local_48->matchSet != '\0') {
        bVar10 = *local_58;
        if (bVar10 == 0) {
          return 2;
        }
        puVar12 = local_60 + -1;
        pbVar15 = local_58;
        do {
          iVar6 = patternCompare(puVar12,pbVar15,local_48,local_4c);
          if (iVar6 != 1) {
            return iVar6;
          }
          if (bVar10 < 0xc0) {
            bVar10 = pbVar15[1];
          }
          else {
            bVar10 = pbVar15[1];
          }
          pbVar15 = pbVar15 + 1;
        } while (bVar10 != 0);
        return 2;
      }
      uVar4 = sqlite3Utf8Read(&local_60);
      if (uVar4 == 0) {
        return 2;
      }
    }
    puVar12 = local_60;
    uVar14 = (ulong)uVar4;
    if (uVar4 < 0x81) {
      if (uVar1 == '\0') {
        local_3e = '\0';
      }
      else {
        local_3e = ""[uVar14];
        local_3d = 0;
        uVar14 = (ulong)(byte)((byte)uVar4 & (~""[uVar14] | 0xdf));
      }
      local_3f = (char)uVar14;
      pbVar15 = local_58;
      while (sVar8 = strcspn((char *)pbVar15,&local_3f), pbVar15[sVar8] != 0) {
        pbVar15 = pbVar15 + sVar8 + 1;
        iVar6 = patternCompare(puVar12,pbVar15,local_48,local_4c);
        if (iVar6 != 1) {
          return iVar6;
        }
      }
    }
    else {
      while( true ) {
        uVar7 = (uint)(char)*local_58;
        if ((char)*local_58 < '\0') {
          uVar7 = sqlite3Utf8Read(&local_58);
        }
        else {
          local_58 = local_58 + 1;
        }
        if (uVar7 == 0) break;
        if ((uVar7 == uVar4) &&
           (iVar6 = patternCompare(puVar12,local_58,local_48,local_4c), iVar6 != 1)) {
          return iVar6;
        }
      }
    }
  }
  return 2;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 matchOther                   /* The escape char (LIKE) or '[' (GLOB) */
){
  u32 c, c2;                       /* Next pattern and input string chars */
  u32 matchOne = pInfo->matchOne;  /* "?" or "_" */
  u32 matchAll = pInfo->matchAll;  /* "*" or "%" */
  u8 noCase = pInfo->noCase;       /* True if uppercase==lowercase */
  const u8 *zEscaped = 0;          /* One past the last escaped input char */
  
  while( (c = Utf8Read(zPattern))!=0 ){
    if( c==matchAll ){  /* Match "*" */
      /* Skip over multiple "*" characters in the pattern.  If there
      ** are also "?" characters, skip those as well, but consume a
      ** single character of the input string for each "?" skipped */
      while( (c=Utf8Read(zPattern)) == matchAll || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return SQLITE_NOWILDCARDMATCH;
        }
      }
      if( c==0 ){
        return SQLITE_MATCH;   /* "*" at the end of the pattern matches */
      }else if( c==matchOther ){
        if( pInfo->matchSet==0 ){
          c = sqlite3Utf8Read(&zPattern);
          if( c==0 ) return SQLITE_NOWILDCARDMATCH;
        }else{
          /* "[...]" immediately follows the "*".  We have to do a slow
          ** recursive search in this case, but it is an unusual case. */
          assert( matchOther<0x80 );  /* '[' is a single-byte character */
          while( *zString ){
            int bMatch = patternCompare(&zPattern[-1],zString,pInfo,matchOther);
            if( bMatch!=SQLITE_NOMATCH ) return bMatch;
            SQLITE_SKIP_UTF8(zString);
          }
          return SQLITE_NOWILDCARDMATCH;
        }
      }

      /* At this point variable c contains the first character of the
      ** pattern string past the "*".  Search in the input string for the
      ** first matching character and recursively continue the match from
      ** that point.
      **
      ** For a case-insensitive search, set variable cx to be the same as
      ** c but in the other case and search the input string for either
      ** c or cx.
      */
      if( c<=0x80 ){
        char zStop[3];
        int bMatch;
        if( noCase ){
          zStop[0] = sqlite3Toupper(c);
          zStop[1] = sqlite3Tolower(c);
          zStop[2] = 0;
        }else{
          zStop[0] = c;
          zStop[1] = 0;
        }
        while(1){
          zString += strcspn((const char*)zString, zStop);
          if( zString[0]==0 ) break;
          zString++;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }else{
        int bMatch;
        while( (c2 = Utf8Read(zString))!=0 ){
          if( c2!=c ) continue;
          bMatch = patternCompare(zPattern,zString,pInfo,matchOther);
          if( bMatch!=SQLITE_NOMATCH ) return bMatch;
        }
      }
      return SQLITE_NOWILDCARDMATCH;
    }
    if( c==matchOther ){
      if( pInfo->matchSet==0 ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ) return SQLITE_NOMATCH;
        zEscaped = zPattern;
      }else{
        u32 prior_c = 0;
        int seen = 0;
        int invert = 0;
        c = sqlite3Utf8Read(&zString);
        if( c==0 ) return SQLITE_NOMATCH;
        c2 = sqlite3Utf8Read(&zPattern);
        if( c2=='^' ){
          invert = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==']' ){
          if( c==']' ) seen = 1;
          c2 = sqlite3Utf8Read(&zPattern);
        }
        while( c2 && c2!=']' ){
          if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
            c2 = sqlite3Utf8Read(&zPattern);
            if( c>=prior_c && c<=c2 ) seen = 1;
            prior_c = 0;
          }else{
            if( c==c2 ){
              seen = 1;
            }
            prior_c = c2;
          }
          c2 = sqlite3Utf8Read(&zPattern);
        }
        if( c2==0 || (seen ^ invert)==0 ){
          return SQLITE_NOMATCH;
        }
        continue;
      }
    }
    c2 = Utf8Read(zString);
    if( c==c2 ) continue;
    if( noCase  && sqlite3Tolower(c)==sqlite3Tolower(c2) && c<0x80 && c2<0x80 ){
      continue;
    }
    if( c==matchOne && zPattern!=zEscaped && c2!=0 ) continue;
    return SQLITE_NOMATCH;
  }
  return *zString==0 ? SQLITE_MATCH : SQLITE_NOMATCH;
}